

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,string_view federateName)

{
  string_view searchValue;
  bool bVar1;
  FedInfo *pFVar2;
  char *in_RSI;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_RDI;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
  *in_stack_ffffffffffffff98;
  FederateState *pFVar3;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffe0;
  
  searchValue._M_str = in_RSI;
  searchValue._M_len = (size_t)in_RDI;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffffe0,searchValue);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            (in_RDI);
  bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                    ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)in_RDI,
                     in_stack_ffffffffffffff98);
  if (bVar1) {
    pFVar2 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator->
                       ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                        &stack0xffffffffffffffd0);
    pFVar3 = pFVar2->fed;
  }
  else {
    pFVar3 = (FederateState *)0x0;
  }
  return pFVar3;
}

Assistant:

FederateState* CommonCore::getFederateCore(std::string_view federateName)
{
    auto fed = loopFederates.find(federateName);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}